

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

char * duckdb_yyjson::yyjson_read_number
                 (char *dat,yyjson_val *val,yyjson_read_flag flg,yyjson_alc *alc,
                 yyjson_read_err *err)

{
  char cVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  ulong extraout_RAX;
  byte bVar20;
  byte bVar21;
  sbyte sVar22;
  char *pcVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  int iVar28;
  uint uVar29;
  u32 uVar30;
  uint uVar31;
  ulong uVar32;
  int iVar33;
  byte *pbVar34;
  ulong uVar35;
  u64 *__s;
  uint64_t uVar36;
  byte *pbVar37;
  ulong uVar38;
  byte *pbVar39;
  ulong uVar40;
  byte *pbVar41;
  byte *pbVar42;
  char cVar43;
  bigint *big;
  long lVar44;
  bool bVar45;
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  char *msg;
  i32 exp;
  u8 *raw_end;
  bigint big_full;
  byte *local_490;
  byte *local_478;
  char *local_470;
  yyjson_val *local_468;
  u8 **local_460;
  yyjson_read_flag local_458;
  uint local_454;
  byte *local_450;
  u8 *local_448;
  bigint local_440;
  bigint local_238;
  
  if (dat == (char *)0x0) {
    if (err == (yyjson_read_err *)0x0) {
      return (char *)0x0;
    }
    err->pos = 0;
    pcVar23 = "input data is NULL";
LAB_01899a7e:
    err->msg = pcVar23;
    err->code = 1;
    return (char *)0x0;
  }
  if (val == (yyjson_val *)0x0) {
    if (err == (yyjson_read_err *)0x0) {
      return (char *)0x0;
    }
    err->pos = 0;
    pcVar23 = "output value is NULL";
    goto LAB_01899a7e;
  }
  cVar43 = (char)flg;
  bVar45 = (flg & 0xa0) != 0;
  local_448 = (u8 *)0x0;
  local_460 = (u8 **)0x0;
  if (bVar45) {
    local_460 = &local_448;
  }
  local_454 = 0;
  if (-1 < cVar43 && bVar45) {
    local_478 = (byte *)dat;
    bVar45 = read_number_raw(&local_478,&local_448,flg,val,&local_470);
    if (bVar45) {
      return (char *)local_478;
    }
    goto LAB_01899a26;
  }
  cVar1 = *dat;
  uVar32 = (ulong)(cVar1 == '-');
  local_478 = (byte *)(dat + uVar32);
  bVar21 = dat[uVar32];
  uVar19 = (ulong)bVar21;
  if ((digi_table[uVar19] & 2) == 0) {
    if (bVar21 == 0x30) {
      local_490 = local_478 + 1;
      bVar21 = digi_table[local_478[1]];
      if ((bVar21 & 0x33) == 0) {
        val->tag = (ulong)(cVar1 == '-') * 8 + 4;
        (val->uni).u64 = 0;
        return (char *)local_490;
      }
      if (local_478[1] == 0x2e) {
        if ((digi_table[local_478[2]] & 3) == 0) {
          local_470 = "no digit after decimal point";
          local_478 = local_478 + 2;
          goto LAB_01899a26;
        }
        local_490 = (byte *)(dat + uVar32 + 1);
        do {
          pbVar39 = local_490;
          uVar32 = (ulong)pbVar39[1];
          local_490 = pbVar39 + 1;
        } while (uVar32 == 0x30);
        bVar21 = digi_table[uVar32];
        if ((bVar21 & 3) != 0) {
          uVar32 = uVar32 - 0x30;
          goto LAB_0189a5c2;
        }
      }
      if ((bVar21 & 3) == 0) {
        if ((bVar21 & 0x20) != 0) {
          local_478 = (byte *)dat;
          yyjson_read_number();
          if ((extraout_RAX & 1) != 0) goto LAB_01899a26;
          local_490 = (byte *)CONCAT44(local_440._4_4_,local_440.used);
        }
        val->tag = 0x14;
        (val->uni).u64 = (ulong)(cVar1 == '-') << 0x3f;
        return (char *)local_490;
      }
      local_470 = "number with leading zero is not allowed";
      local_478 = local_490 + -1;
      goto LAB_01899a26;
    }
    if ((flg & 0x10) != 0) {
      uVar19 = (long)local_478 - (ulong)(cVar1 == '-');
      if (bVar21 < 0x69) {
        if (bVar21 == 0x49) {
LAB_0189aabf:
          if (((local_478[1] | 0x20) == 0x6e) && ((local_478[2] | 0x20) == 0x66)) {
            pbVar42 = local_478 + 3;
            if (((local_478[3] | 0x20) == 0x69) &&
               (((((local_478[4] | 0x20) == 0x6e && ((local_478[5] | 0x20) == 0x69)) &&
                 ((local_478[6] | 0x20) == 0x74)) && ((local_478[7] | 0x20) == 0x79)))) {
              pbVar42 = local_478 + 8;
            }
            if ((flg & 0xa0) == 0) goto LAB_0189ab48;
            val->tag = ((long)pbVar42 - uVar19) * 0x100 + 1;
            goto LAB_01899d97;
          }
          if ((bVar21 | 0x20) == 0x6e) goto LAB_0189ab7e;
        }
        else if (bVar21 == 0x4e) goto LAB_0189ab7e;
      }
      else if (bVar21 == 0x6e) {
LAB_0189ab7e:
        if (((local_478[1] | 0x20) == 0x61) && ((local_478[2] | 0x20) == 0x6e)) {
          local_478 = local_478 + 3;
          if ((flg & 0xa0) == 0) {
            val->tag = 0x14;
            (val->uni).str = (char *)(((ulong)(cVar1 != '-') << 0x3f) + -0x8000000000000);
            return (char *)local_478;
          }
          val->tag = (ulong)(cVar1 == '-') * 0x100 + 0x301;
LAB_01899776:
          (val->uni).u64 = uVar19;
          return (char *)local_478;
        }
      }
      else if (bVar21 == 0x69) goto LAB_0189aabf;
    }
    local_470 = "no digit after minus sign";
    goto LAB_01899a26;
  }
  uVar32 = uVar19 - 0x30;
  bVar21 = local_478[1];
  uVar40 = (ulong)bVar21 - 0x30;
  if (uVar40 < 10) {
    uVar32 = uVar40 + uVar32 * 10;
    bVar21 = local_478[2];
    uVar19 = (ulong)bVar21 - 0x30;
    if (uVar19 < 10) {
      uVar32 = uVar19 + uVar32 * 10;
      bVar21 = local_478[3];
      uVar19 = (ulong)bVar21 - 0x30;
      if (uVar19 < 10) {
        uVar32 = uVar19 + uVar32 * 10;
        bVar21 = local_478[4];
        uVar19 = (ulong)bVar21 - 0x30;
        if (uVar19 < 10) {
          uVar32 = uVar19 + uVar32 * 10;
          bVar21 = local_478[5];
          uVar19 = (ulong)bVar21 - 0x30;
          if (uVar19 < 10) {
            uVar32 = uVar19 + uVar32 * 10;
            bVar21 = local_478[6];
            uVar19 = (ulong)bVar21 - 0x30;
            if (uVar19 < 10) {
              uVar32 = uVar19 + uVar32 * 10;
              bVar21 = local_478[7];
              uVar19 = (ulong)bVar21 - 0x30;
              if (uVar19 < 10) {
                uVar32 = uVar19 + uVar32 * 10;
                bVar21 = local_478[8];
                uVar19 = (ulong)bVar21 - 0x30;
                if (uVar19 < 10) {
                  uVar32 = uVar19 + uVar32 * 10;
                  bVar21 = local_478[9];
                  uVar19 = (ulong)bVar21 - 0x30;
                  if (uVar19 < 10) {
                    uVar32 = uVar19 + uVar32 * 10;
                    bVar21 = local_478[10];
                    uVar19 = (ulong)bVar21 - 0x30;
                    if (uVar19 < 10) {
                      uVar32 = uVar19 + uVar32 * 10;
                      bVar21 = local_478[0xb];
                      uVar19 = (ulong)bVar21 - 0x30;
                      if (uVar19 < 10) {
                        uVar32 = uVar19 + uVar32 * 10;
                        bVar21 = local_478[0xc];
                        uVar19 = (ulong)bVar21 - 0x30;
                        if (uVar19 < 10) {
                          uVar32 = uVar19 + uVar32 * 10;
                          bVar21 = local_478[0xd];
                          uVar19 = (ulong)bVar21 - 0x30;
                          if (uVar19 < 10) {
                            uVar32 = uVar19 + uVar32 * 10;
                            bVar21 = local_478[0xe];
                            uVar19 = (ulong)bVar21 - 0x30;
                            if (uVar19 < 10) {
                              uVar32 = uVar19 + uVar32 * 10;
                              bVar21 = local_478[0xf];
                              uVar19 = (ulong)bVar21 - 0x30;
                              if (uVar19 < 10) {
                                uVar32 = uVar19 + uVar32 * 10;
                                bVar21 = local_478[0x10];
                                uVar19 = (ulong)bVar21 - 0x30;
                                if (uVar19 < 10) {
                                  uVar32 = uVar19 + uVar32 * 10;
                                  bVar21 = local_478[0x11];
                                  uVar19 = (ulong)bVar21 - 0x30;
                                  if (uVar19 < 10) {
                                    uVar32 = uVar19 + uVar32 * 10;
                                    bVar21 = local_478[0x12];
                                    uVar19 = (ulong)bVar21 - 0x30;
                                    if (uVar19 < 10) {
                                      uVar32 = uVar19 + uVar32 * 10;
                                      pbVar42 = local_478 + 0x13;
                                      bVar21 = local_478[0x13];
                                      bVar20 = digi_table[bVar21];
                                      if ((bVar20 & 0x33) != 0) {
                                        if (((bVar20 & 3) != 0) &&
                                           ((digi_table[local_478[0x14]] & 0x33) == 0)) {
                                          uVar19 = (ulong)bVar21 - 0x30;
                                          if ((uVar32 < 0x1999999999999999) ||
                                             ((uVar32 == 0x1999999999999999 && (uVar19 < 6)))) {
                                            local_478 = local_478 + 0x14;
                                            uVar19 = uVar19 + uVar32 * 10;
                                            if (cVar1 == '-') {
                                              if (cVar43 < '\0') {
                                                if (*local_460 != (u8 *)0x0) {
                                                  **local_460 = '\0';
                                                }
                                                val->tag = ((long)local_478 - (long)dat) * 0x100 + 1
                                                ;
                                                (val->uni).str = dat;
                                                *local_460 = local_478;
                                                return (char *)local_478;
                                              }
                                              auVar48._8_4_ = (int)(uVar19 >> 0x20);
                                              auVar48._0_8_ = uVar19;
                                              auVar48._12_4_ = 0x45300000;
                                              val->tag = 0x14;
                                              (val->uni).f64 =
                                                   -((auVar48._8_8_ - 1.9342813113834067e+25) +
                                                    ((double)CONCAT44(0x43300000,(int)uVar19) -
                                                    4503599627370496.0));
                                              return (char *)local_478;
                                            }
                                            val->tag = 4;
                                            goto LAB_01899776;
                                          }
                                        }
                                        pbVar37 = (byte *)0x0;
                                        local_490 = pbVar42;
                                        if ((bVar20 & 0x20) == 0) {
                                          if (bVar21 == 0x2e) {
                                            bVar21 = local_478[0x14];
                                            pbVar39 = local_478 + 0x14;
                                            if ((digi_table[bVar21] & 3) == 0) {
                                              local_470 = "no digit after decimal point";
                                              local_478 = pbVar39;
                                              goto LAB_01899a26;
                                            }
                                          }
                                          else {
                                            local_490 = (byte *)0x0;
                                            pbVar39 = pbVar42;
                                          }
LAB_018996dc:
                                          uVar36 = (long)pbVar39 * 0x100 + (long)dat * -0x100 + 1;
                                          local_478 = pbVar39 + 1;
                                          do {
                                            pbVar37 = local_478;
                                            bVar20 = digi_table[*pbVar37];
                                            local_478 = pbVar37 + 1;
                                            uVar36 = uVar36 + 0x100;
                                          } while ((bVar20 & 3) != 0);
                                          pbVar42 = pbVar37;
                                          if (local_490 == (byte *)0x0) {
                                            if ((cVar43 < '\0') && ((bVar20 & 0x30) == 0)) {
                                              if (*local_460 != (u8 *)0x0) {
                                                **local_460 = '\0';
                                              }
                                              val->tag = uVar36;
                                              (val->uni).str = dat;
                                              *local_460 = pbVar37;
                                              return (char *)pbVar37;
                                            }
                                            local_490 = pbVar37;
                                            if (*pbVar37 == 0x2e) {
                                              if ((digi_table[*local_478] & 3) == 0) {
                                                local_470 = "no digit after decimal point";
                                                goto LAB_01899a26;
                                              }
                                              do {
                                                pbVar42 = pbVar37 + 1;
                                                bVar20 = digi_table[pbVar37[1]];
                                                pbVar37 = pbVar42;
                                              } while ((bVar20 & 3) != 0);
                                            }
                                          }
                                          uVar32 = uVar32 + (0x34 < bVar21);
                                          pbVar34 = pbVar42;
                                          do {
                                            do {
                                              pbVar34 = pbVar34 + -1;
                                            } while (*pbVar34 == 0x30);
                                          } while (*pbVar34 == 0x2e);
                                          pbVar37 = local_490 +
                                                    ((ulong)(local_490 < pbVar39) - (long)pbVar39);
                                          bVar45 = pbVar34 < pbVar39;
                                          pbVar34 = pbVar39;
                                          pbVar39 = pbVar42;
                                          if (bVar45) {
                                            pbVar34 = (byte *)0x0;
                                            pbVar39 = (byte *)0x0;
                                          }
                                          if ((bVar20 & 0x20) != 0) goto LAB_018997ee;
LAB_01899872:
                                          if ((long)pbVar37 < -0x157) goto LAB_01899e1f;
                                          if ((long)pbVar37 < 0x135) goto LAB_0189988c;
                                          if (cVar43 < '\0') {
                                            if (*local_460 != (u8 *)0x0) {
                                              **local_460 = '\0';
                                            }
                                            val->tag = ((long)pbVar42 - (long)dat) * 0x100 + 1;
                                            (val->uni).str = dat;
                                            *local_460 = pbVar42;
                                            return (char *)pbVar42;
                                          }
                                        }
                                        else {
                                          pbVar39 = (byte *)0x0;
                                          pbVar34 = (byte *)0x0;
LAB_018997ee:
                                          bVar21 = pbVar42[1];
                                          uVar19 = (ulong)((digi_table[bVar21] & 0xc) != 0);
                                          if ((digi_table[pbVar42[uVar19 + 1]] & 3) == 0) {
                                            local_470 = "no digit after exponent sign";
                                            local_478 = pbVar42 + uVar19 + 1;
                                            goto LAB_01899a26;
                                          }
                                          pbVar41 = pbVar42 + uVar19;
                                          pbVar42 = pbVar41;
                                          do {
                                            uVar19 = (ulong)pbVar42[1];
                                            pbVar42 = pbVar42 + 1;
                                            pbVar41 = pbVar41 + 1;
                                          } while (uVar19 == 0x30);
                                          if ((digi_table[uVar19] & 3) == 0) {
                                            lVar44 = 0;
                                          }
                                          else {
                                            lVar44 = 0;
                                            do {
                                              lVar44 = (ulong)(byte)((char)uVar19 - 0x30) +
                                                       lVar44 * 10;
                                              uVar19 = (ulong)pbVar42[1];
                                              pbVar42 = pbVar42 + 1;
                                            } while ((digi_table[uVar19] & 3) != 0);
                                          }
                                          if ((long)pbVar42 - (long)pbVar41 < 0x13) {
                                            lVar24 = -lVar44;
                                            if (bVar21 != 0x2d) {
                                              lVar24 = lVar44;
                                            }
                                            pbVar37 = pbVar37 + lVar24;
                                            goto LAB_01899872;
                                          }
                                          if (bVar21 == 0x2d) goto LAB_01899e1f;
                                          if (cVar43 < '\0') {
                                            if (*local_460 != (u8 *)0x0) {
                                              **local_460 = '\0';
                                            }
                                            val->tag = ((long)pbVar42 - (long)dat) * 0x100 + 1;
                                            (val->uni).str = dat;
                                            *local_460 = pbVar42;
                                            return (char *)pbVar42;
                                          }
                                        }
                                        if ((flg & 0x10) != 0) {
LAB_0189ab48:
                                          val->tag = 0x14;
                                          (val->uni).str =
                                               (char *)(((ulong)(cVar1 != '-') << 0x3f) +
                                                       -0x10000000000000);
                                          return (char *)pbVar42;
                                        }
                                        local_470 = "number is infinity when parsed as double";
                                        local_478 = (byte *)dat;
                                        goto LAB_01899a26;
                                      }
                                      if ((cVar1 == '-') && (0x8000000000000000 < uVar32)) {
                                        if (cVar43 < '\0') {
                                          if (*local_460 != (u8 *)0x0) {
                                            **local_460 = '\0';
                                          }
                                          val->tag = ((long)pbVar42 - (long)dat) * 0x100 + 1;
                                          (val->uni).str = dat;
                                          *local_460 = pbVar42;
                                          return (char *)pbVar42;
                                        }
                                        auVar47._8_4_ = (int)(uVar32 >> 0x20);
                                        auVar47._0_8_ = uVar32;
                                        auVar47._12_4_ = 0x45300000;
                                        val->tag = 0x14;
                                        (val->uni).f64 =
                                             -((auVar47._8_8_ - 1.9342813113834067e+25) +
                                              ((double)CONCAT44(0x43300000,(int)uVar32) -
                                              4503599627370496.0));
                                        return (char *)pbVar42;
                                      }
                                    }
                                    else {
                                      pbVar42 = local_478 + 0x12;
                                      if ((digi_table[bVar21] & 0x30) != 0) {
                                        local_490 = pbVar42;
                                        if (bVar21 != 0x2e) goto LAB_0189a97d;
                                        goto LAB_0189a78d;
                                      }
                                    }
                                  }
                                  else {
                                    pbVar42 = local_478 + 0x11;
                                    if ((digi_table[bVar21] & 0x30) != 0) {
                                      local_490 = pbVar42;
                                      if (bVar21 != 0x2e) goto LAB_0189a97d;
                                      goto LAB_0189a772;
                                    }
                                  }
                                }
                                else {
                                  pbVar42 = local_478 + 0x10;
                                  if ((digi_table[bVar21] & 0x30) != 0) {
                                    local_490 = pbVar42;
                                    if (bVar21 != 0x2e) goto LAB_0189a97d;
                                    goto LAB_0189a757;
                                  }
                                }
                              }
                              else {
                                pbVar42 = local_478 + 0xf;
                                if ((digi_table[bVar21] & 0x30) != 0) {
                                  local_490 = pbVar42;
                                  if (bVar21 != 0x2e) goto LAB_0189a97d;
                                  goto LAB_0189a73c;
                                }
                              }
                            }
                            else {
                              pbVar42 = local_478 + 0xe;
                              if ((digi_table[bVar21] & 0x30) != 0) {
                                local_490 = pbVar42;
                                if (bVar21 != 0x2e) goto LAB_0189a97d;
                                goto LAB_0189a721;
                              }
                            }
                          }
                          else {
                            pbVar42 = local_478 + 0xd;
                            if ((digi_table[bVar21] & 0x30) != 0) {
                              local_490 = pbVar42;
                              if (bVar21 != 0x2e) goto LAB_0189a97d;
                              goto LAB_0189a706;
                            }
                          }
                        }
                        else {
                          pbVar42 = local_478 + 0xc;
                          if ((digi_table[bVar21] & 0x30) != 0) {
                            local_490 = pbVar42;
                            if (bVar21 != 0x2e) goto LAB_0189a97d;
                            goto LAB_0189a6eb;
                          }
                        }
                      }
                      else {
                        pbVar42 = local_478 + 0xb;
                        if ((digi_table[bVar21] & 0x30) != 0) {
                          local_490 = pbVar42;
                          if (bVar21 != 0x2e) goto LAB_0189a97d;
                          goto LAB_0189a6d0;
                        }
                      }
                    }
                    else {
                      pbVar42 = local_478 + 10;
                      if ((digi_table[bVar21] & 0x30) != 0) {
                        local_490 = pbVar42;
                        if (bVar21 != 0x2e) goto LAB_0189a97d;
                        goto LAB_0189a6b5;
                      }
                    }
                  }
                  else {
                    pbVar42 = local_478 + 9;
                    if ((digi_table[bVar21] & 0x30) != 0) {
                      local_490 = pbVar42;
                      if (bVar21 != 0x2e) goto LAB_0189a97d;
                      goto LAB_0189a69a;
                    }
                  }
                }
                else {
                  pbVar42 = local_478 + 8;
                  if ((digi_table[bVar21] & 0x30) != 0) {
                    local_490 = pbVar42;
                    if (bVar21 != 0x2e) goto LAB_0189a97d;
                    goto LAB_0189a67f;
                  }
                }
              }
              else {
                pbVar42 = local_478 + 7;
                if ((digi_table[bVar21] & 0x30) != 0) {
                  local_490 = pbVar42;
                  if (bVar21 != 0x2e) goto LAB_0189a97d;
                  goto LAB_0189a664;
                }
              }
            }
            else {
              pbVar42 = local_478 + 6;
              if ((digi_table[bVar21] & 0x30) != 0) {
                local_490 = pbVar42;
                if (bVar21 != 0x2e) goto LAB_0189a97d;
                goto LAB_0189a649;
              }
            }
          }
          else {
            pbVar42 = local_478 + 5;
            if ((digi_table[bVar21] & 0x30) != 0) {
              local_490 = pbVar42;
              if (bVar21 != 0x2e) goto LAB_0189a97d;
              goto LAB_0189a62e;
            }
          }
        }
        else {
          pbVar42 = local_478 + 4;
          if ((digi_table[bVar21] & 0x30) != 0) {
            local_490 = pbVar42;
            if (bVar21 != 0x2e) goto LAB_0189a97d;
            goto LAB_0189a613;
          }
        }
      }
      else {
        pbVar42 = local_478 + 3;
        if ((digi_table[bVar21] & 0x30) != 0) {
          local_490 = pbVar42;
          if (bVar21 != 0x2e) goto LAB_0189a97d;
          goto LAB_0189a5f8;
        }
      }
    }
    else {
      pbVar42 = local_478 + 2;
      if ((digi_table[bVar21] & 0x30) != 0) {
        local_490 = pbVar42;
        if (bVar21 == 0x2e) goto LAB_0189a5dd;
        goto LAB_0189a97d;
      }
    }
    val->tag = (ulong)(cVar1 == '-') * 8 + 4;
    uVar19 = -uVar32;
    if (cVar1 != '-') {
      uVar19 = uVar32;
    }
    goto LAB_01899d97;
  }
  pbVar42 = local_478 + 1;
  if ((digi_table[bVar21] & 0x30) == 0) {
    val->tag = (ulong)(cVar1 == '-') * 8 + 4;
    if (cVar1 == '-') {
      uVar32 = 0x30 - uVar19;
    }
    (val->uni).u64 = uVar32;
    return (char *)pbVar42;
  }
  pbVar39 = local_478;
  if (bVar21 != 0x2e) {
LAB_0189a97d:
    pbVar37 = (byte *)0x0;
    pbVar39 = pbVar42;
    local_490 = pbVar42;
LAB_0189a9f6:
    pbVar34 = (byte *)0x0;
    pbVar42 = pbVar39;
    goto LAB_018997ee;
  }
LAB_0189a5c2:
  local_490 = local_478 + 1;
  bVar21 = pbVar39[2];
  if ((ulong)bVar21 - 0x30 < 10) {
    uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
    local_478 = pbVar39;
LAB_0189a5dd:
    bVar21 = local_478[3];
    if ((ulong)bVar21 - 0x30 < 10) {
      uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a5f8:
      bVar21 = local_478[4];
      if ((ulong)bVar21 - 0x30 < 10) {
        uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a613:
        bVar21 = local_478[5];
        if ((ulong)bVar21 - 0x30 < 10) {
          uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a62e:
          bVar21 = local_478[6];
          if ((ulong)bVar21 - 0x30 < 10) {
            uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a649:
            bVar21 = local_478[7];
            if ((ulong)bVar21 - 0x30 < 10) {
              uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a664:
              bVar21 = local_478[8];
              if ((ulong)bVar21 - 0x30 < 10) {
                uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a67f:
                bVar21 = local_478[9];
                if ((ulong)bVar21 - 0x30 < 10) {
                  uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a69a:
                  bVar21 = local_478[10];
                  if ((ulong)bVar21 - 0x30 < 10) {
                    uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a6b5:
                    bVar21 = local_478[0xb];
                    if ((ulong)bVar21 - 0x30 < 10) {
                      uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a6d0:
                      bVar21 = local_478[0xc];
                      if ((ulong)bVar21 - 0x30 < 10) {
                        uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a6eb:
                        bVar21 = local_478[0xd];
                        if ((ulong)bVar21 - 0x30 < 10) {
                          uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a706:
                          bVar21 = local_478[0xe];
                          if ((ulong)bVar21 - 0x30 < 10) {
                            uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a721:
                            bVar21 = local_478[0xf];
                            if ((ulong)bVar21 - 0x30 < 10) {
                              uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a73c:
                              bVar21 = local_478[0x10];
                              if ((ulong)bVar21 - 0x30 < 10) {
                                uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a757:
                                bVar21 = local_478[0x11];
                                if ((ulong)bVar21 - 0x30 < 10) {
                                  uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a772:
                                  bVar21 = local_478[0x12];
                                  if ((ulong)bVar21 - 0x30 < 10) {
                                    uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
LAB_0189a78d:
                                    bVar21 = local_478[0x13];
                                    if ((ulong)bVar21 - 0x30 < 10) {
                                      uVar32 = ((ulong)bVar21 - 0x30) + uVar32 * 10;
                                      bVar21 = local_478[0x14];
                                      pbVar39 = local_478 + 0x14;
                                      if ((digi_table[bVar21] & 3) != 0) goto LAB_018996dc;
                                    }
                                    else {
                                      pbVar39 = local_478 + 0x13;
                                    }
                                  }
                                  else {
                                    pbVar39 = local_478 + 0x12;
                                  }
                                }
                                else {
                                  pbVar39 = local_478 + 0x11;
                                }
                              }
                              else {
                                pbVar39 = local_478 + 0x10;
                              }
                            }
                            else {
                              pbVar39 = local_478 + 0xf;
                            }
                          }
                          else {
                            pbVar39 = local_478 + 0xe;
                          }
                        }
                        else {
                          pbVar39 = local_478 + 0xd;
                        }
                      }
                      else {
                        pbVar39 = local_478 + 0xc;
                      }
                    }
                    else {
                      pbVar39 = local_478 + 0xb;
                    }
                  }
                  else {
                    pbVar39 = local_478 + 10;
                  }
                }
                else {
                  pbVar39 = local_478 + 9;
                }
              }
              else {
                pbVar39 = local_478 + 8;
              }
            }
            else {
              pbVar39 = local_478 + 7;
            }
          }
          else {
            pbVar39 = local_478 + 6;
          }
        }
        else {
          pbVar39 = local_478 + 5;
        }
      }
      else {
        pbVar39 = local_478 + 4;
      }
    }
    else {
      pbVar39 = local_478 + 3;
    }
  }
  else {
    pbVar39 = pbVar39 + 2;
  }
  if (local_490 + 1 == pbVar39) {
    local_470 = "no digit after decimal point";
    local_478 = pbVar39;
    goto LAB_01899a26;
  }
  pbVar37 = local_490 + (1 - (long)pbVar39);
  if ((digi_table[bVar21] & 0x20) != 0) goto LAB_0189a9f6;
  pbVar42 = pbVar39;
  if ((long)pbVar37 < -0x157) {
LAB_01899e1f:
    val->tag = 0x14;
    uVar19 = (ulong)(cVar1 == '-') << 0x3f;
    goto LAB_01899d97;
  }
  pbVar34 = (byte *)0x0;
LAB_0189988c:
  local_454 = (uint)pbVar37;
  if ((uVar32 >> 0x35 == 0) && (local_454 + 0x16 < 0x2d)) {
    if ((int)local_454 < 0) {
      dVar46 = (double)(long)uVar32 / *(double *)(f64_pow10_table + (ulong)-local_454 * 8);
    }
    else {
      dVar46 = (double)(long)uVar32 *
               *(double *)(f64_pow10_table + (ulong)(local_454 & 0x7fffffff) * 8);
    }
    val->tag = 0x14;
    if (cVar1 == '-') {
      dVar46 = -dVar46;
    }
    (val->uni).f64 = dVar46;
    return (char *)pbVar42;
  }
  if ((local_454 + 0x132 < 0x252) && (pbVar34 == (byte *)0x0)) {
    lVar44 = (long)(int)(local_454 * 2 + 0x2ae);
    uVar19 = 0x3f;
    if (uVar32 != 0) {
      for (; uVar32 >> uVar19 == 0; uVar19 = uVar19 - 1) {
      }
    }
    iVar33 = (int)(uVar19 ^ 0x3f);
    uVar40 = uVar32 << ((byte)(uVar19 ^ 0x3f) & 0x3f);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar40;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)(pow10_sig_table + lVar44 * 8);
    auVar3 = auVar3 * auVar8;
    lVar24 = auVar3._8_8_;
    uVar19 = auVar3._0_8_;
    iVar28 = (int)(local_454 * 0x3526a + -0x3f0000) >> 0x10;
    if (0x1fd < (ulong)(auVar3._8_4_ & 0x1ff) - 1) {
      lVar27 = (long)(int)(local_454 * 2 + 0x2af);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar40;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(pow10_sig_table + lVar27 * 8);
      lVar25 = SUB168(auVar4 * auVar9,8);
      if (0xfffffffffffffffd < (lVar25 + uVar19) - 1) goto LAB_01899e73;
      lVar24 = lVar24 + (ulong)(lVar25 + uVar19 < uVar19);
    }
    uVar19 = lVar24 << (-1 < lVar24);
    uVar19 = (uVar19 & 0x400) + uVar19;
    val->tag = 0x14;
    uVar19 = (ulong)(cVar1 == '-') << 0x3f |
             uVar19 >> 0xb & 0xfffffffffffff |
             (ulong)(((iVar28 - iVar33) - (uint)(-1 < lVar24)) + 0x47e + (uint)(uVar19 < 0x400)) <<
             0x34;
LAB_01899d97:
    (val->uni).u64 = uVar19;
    return (char *)pbVar42;
  }
  uVar19 = 0x3f;
  if (uVar32 != 0) {
    for (; uVar32 >> uVar19 == 0; uVar19 = uVar19 - 1) {
    }
  }
  iVar33 = (int)(uVar19 ^ 0x3f);
  uVar40 = uVar32 << ((byte)(uVar19 ^ 0x3f) & 0x3f);
  lVar44 = (long)(int)(local_454 * 2 + 0x2ae);
  lVar27 = (long)(int)(local_454 * 2 + 0x2af);
  iVar28 = (int)(local_454 * 0x3526a + -0x3f0000) >> 0x10;
LAB_01899e73:
  lVar24 = ((ulong)(pbVar34 != (byte *)0x0) << 2) << ((byte)iVar33 & 0x3f);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar40;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(long *)(pow10_sig_table + lVar44 * 8) - (*(long *)(pow10_sig_table + lVar27 * 8) >> 0x3f);
  uVar40 = SUB168(auVar5 * auVar10,8) - (SUB168(auVar5 * auVar10,0) >> 0x3f);
  uVar19 = 0x3f;
  if (uVar40 != 0) {
    for (; uVar40 >> uVar19 == 0; uVar19 = uVar19 - 1) {
    }
  }
  bVar21 = (byte)(uVar19 ^ 0x3f);
  uVar40 = uVar40 << (bVar21 & 0x3f);
  uVar38 = (9 - (ulong)(lVar24 == 0)) + lVar24 << (bVar21 & 0x3f);
  uVar29 = ((iVar28 - (int)(uVar19 ^ 0x3f)) - iVar33) + 0x40;
  iVar28 = 0xb;
  if (((int)uVar29 < -0x43d) &&
     ((iVar28 = 0x40, uVar29 < 0xfffffb8f || (iVar28 = -0x432 - uVar29, uVar29 < 0xfffffb92)))) {
    bVar21 = (char)iVar28 - 0x3c;
    uVar40 = uVar40 >> (bVar21 & 0x3f);
    uVar29 = (uVar29 + iVar28) - 0x3c;
    uVar38 = (uVar38 >> (bVar21 & 0x3f)) + 9;
    iVar28 = 0x3c;
  }
  bVar21 = (byte)iVar28;
  uVar35 = (~(-1L << (bVar21 & 0x3f)) & uVar40) * 8;
  lVar44 = 8L << (bVar21 - 1 & 0x3f);
  uVar19 = lVar44 + uVar38;
  uVar40 = (ulong)(uVar19 <= uVar35) + (uVar40 >> (bVar21 & 0x3f));
  local_450 = (byte *)dat;
  local_468 = val;
  if (uVar40 == 0) {
LAB_0189a183:
    uVar40 = 0;
LAB_01899f82:
    if ((uVar35 <= lVar44 - uVar38) || (uVar19 <= uVar35)) {
      val->tag = 0x14;
      (val->uni).u64 = uVar40 | (ulong)(cVar1 == '-') << 0x3f;
      return (char *)pbVar42;
    }
    uVar29 = 0xfffffbcd;
    if (0xfffffffffffff < uVar40) {
      uVar29 = (uint)(uVar40 >> 0x34) - 0x434;
    }
    uVar19 = (uVar40 & 0xfffffffffffff) + 0x10000000000000;
    if (0xfffffffffffff >= uVar40) {
      uVar19 = uVar40;
    }
    big = &local_440;
    local_478 = (byte *)dat;
    local_458 = flg;
    bigint_set_buf(big,uVar32,(i32 *)&local_454,pbVar34,pbVar39,local_490);
    local_238.bits[0] = uVar19 * 2 + 1;
    if ((int)local_454 < 0) {
      if (local_454 < 0xffffffee) {
        uVar30 = 1;
        uVar26 = -local_454;
        do {
          uVar32 = (ulong)uVar30;
          uVar19 = 0;
          if (uVar30 == 0) {
LAB_0189a21e:
            if ((uint)uVar19 < uVar30) {
              uVar19 = uVar19 & 0xffffffff;
              uVar38 = 0;
              do {
                auVar16._8_8_ = 0;
                auVar16._0_8_ = uVar38;
                auVar12._8_8_ = 0;
                auVar12._0_8_ = local_238.bits[uVar19];
                auVar16 = ZEXT816(10000000000000000000) * auVar12 + auVar16;
                uVar38 = auVar16._8_8_;
                local_238.bits[uVar19] = auVar16._0_8_;
                uVar19 = uVar19 + 1;
              } while (uVar32 != uVar19);
              if (uVar38 != 0) {
                uVar30 = uVar30 + 1;
                local_238.bits[uVar32] = uVar38;
              }
            }
          }
          else {
            uVar19 = 0;
            do {
              if (local_238.bits[uVar19] != 0) goto LAB_0189a21e;
              uVar19 = uVar19 + 1;
            } while (uVar32 != uVar19);
          }
          uVar31 = uVar26 - 0x13;
          bVar45 = 0x25 < (int)uVar26;
          uVar26 = uVar31;
        } while (bVar45);
        if (uVar31 != 0) {
          uVar19 = *(ulong *)(u64_pow10_table + (long)(int)uVar31 * 8);
          if (uVar30 != 0) goto LAB_0189a322;
          uVar30 = 0;
          uVar32 = 0;
LAB_0189a28c:
          if ((uint)uVar32 < uVar30) {
            uVar32 = uVar32 & 0xffffffff;
            uVar35 = 0;
            do {
              auVar17._8_8_ = 0;
              auVar17._0_8_ = uVar35;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = uVar19;
              auVar13._8_8_ = 0;
              auVar13._0_8_ = local_238.bits[uVar32];
              auVar17 = auVar6 * auVar13 + auVar17;
              uVar35 = auVar17._8_8_;
              local_238.bits[uVar32] = auVar17._0_8_;
              uVar32 = uVar32 + 1;
            } while (uVar30 != uVar32);
            if (uVar35 != 0) {
              uVar38 = (ulong)(uVar30 + 1);
              big = &local_238;
              goto LAB_0189a37d;
            }
          }
        }
        uVar38 = (ulong)uVar30;
      }
      else {
        uVar19 = *(ulong *)(u64_pow10_table + (ulong)-local_454 * 8);
        uVar30 = 1;
LAB_0189a322:
        uVar38 = (ulong)uVar30;
        uVar32 = 0;
        do {
          if (local_238.bits[uVar32] != 0) goto LAB_0189a28c;
          uVar32 = uVar32 + 1;
        } while (uVar38 != uVar32);
      }
    }
    else {
      uVar31 = local_454;
      uVar30 = local_440.used;
      uVar26 = local_454;
      if (0x12 < local_454) {
        do {
          uVar32 = (ulong)local_440.used;
          uVar19 = 0;
          uVar30 = local_440.used;
          if (local_440.used == 0) {
LAB_0189a123:
            if ((uint)uVar19 < local_440.used) {
              uVar19 = uVar19 & 0xffffffff;
              uVar38 = 0;
              do {
                auVar15._8_8_ = 0;
                auVar15._0_8_ = uVar38;
                auVar11._8_8_ = 0;
                auVar11._0_8_ = local_440.bits[uVar19];
                auVar15 = ZEXT816(10000000000000000000) * auVar11 + auVar15;
                uVar38 = auVar15._8_8_;
                local_440.bits[uVar19] = auVar15._0_8_;
                uVar19 = uVar19 + 1;
              } while (uVar32 != uVar19);
              if (uVar38 != 0) {
                local_440.bits[uVar32] = uVar38;
                uVar30 = local_440.used + 1;
              }
            }
          }
          else {
            uVar19 = 0;
            do {
              if (local_440.bits[uVar19] != 0) goto LAB_0189a123;
              uVar19 = uVar19 + 1;
            } while (uVar32 != uVar19);
          }
          uVar26 = uVar31 - 0x13;
          bVar45 = 0x25 < (int)uVar31;
          uVar31 = uVar26;
          local_440.used = uVar30;
        } while (bVar45);
      }
      local_440.used = uVar30;
      uVar38 = 1;
      if (uVar26 != 0) {
        uVar19 = *(ulong *)(u64_pow10_table + (long)(int)uVar26 * 8);
        if (uVar30 == 0) {
          uVar32 = 0;
LAB_0189a341:
          if ((uint)uVar32 < uVar30) {
            uVar32 = uVar32 & 0xffffffff;
            uVar35 = 0;
            do {
              auVar18._8_8_ = 0;
              auVar18._0_8_ = uVar35;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar19;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = local_440.bits[uVar32];
              auVar18 = auVar7 * auVar14 + auVar18;
              uVar35 = auVar18._8_8_;
              local_440.bits[uVar32] = auVar18._0_8_;
              uVar32 = uVar32 + 1;
            } while (uVar30 != uVar32);
            if (uVar35 != 0) {
              local_440.used = uVar30 + 1;
              uVar38 = 1;
LAB_0189a37d:
              big->bits[uVar30] = uVar35;
            }
          }
        }
        else {
          uVar32 = 0;
          do {
            if (local_440.bits[uVar32] != 0) goto LAB_0189a341;
            uVar32 = uVar32 + 1;
          } while (uVar30 != uVar32);
        }
      }
    }
    uVar26 = (uint)uVar38;
    if ((int)uVar29 < 1) {
      uVar29 = -uVar29;
      uVar31 = uVar29 >> 6;
      uVar19 = (ulong)local_440.used;
      if ((uVar29 & 0x3f) == 0) {
        if (uVar19 != 0) {
          do {
            local_440.bits[((uVar29 >> 6) - 1) + (int)uVar19] = local_440.bits[uVar19 - 1];
            uVar19 = uVar19 - 1;
          } while (uVar19 != 0);
        }
        local_440.used = local_440.used + uVar31;
      }
      else {
        local_440.bits[uVar19] = 0;
        sVar22 = (sbyte)(uVar29 & 0x3f);
        if (uVar19 != 0) {
          do {
            local_440.bits[(uVar29 >> 6) + (int)uVar19] =
                 local_440.bits[uVar19 - 1] >> (0x40U - sVar22 & 0x3f) |
                 local_440.bits[uVar19] << sVar22;
            uVar19 = uVar19 - 1;
          } while (uVar19 != 0);
        }
        local_440.bits[uVar31] = local_440.bits[0] << sVar22;
        local_440.used =
             (local_440.used + uVar31 + 1) - (uint)(local_440.bits[local_440.used + uVar31] == 0);
      }
      if (0x3f < uVar29) {
        __s = local_440.bits;
        goto LAB_0189a4b6;
      }
    }
    else {
      __s = local_238.bits;
      uVar31 = uVar29 >> 6;
      if ((uVar29 & 0x3f) == 0) {
        if (uVar26 != 0) {
          do {
            local_238.bits[((uVar29 >> 6) - 1) + (int)uVar38] = local_238.bits[uVar38 - 1];
            uVar38 = uVar38 - 1;
          } while (uVar38 != 0);
        }
        uVar26 = uVar26 + uVar31;
      }
      else {
        local_238.bits[uVar38] = 0;
        sVar22 = (sbyte)(uVar29 & 0x3f);
        if (uVar26 != 0) {
          do {
            local_238.bits[(uVar29 >> 6) + (int)uVar38] =
                 local_238.bits[uVar38 - 1] >> (0x40U - sVar22 & 0x3f) |
                 local_238.bits[uVar38] << sVar22;
            uVar38 = uVar38 - 1;
          } while (uVar38 != 0);
        }
        local_238.bits[uVar31] = local_238.bits[0] << sVar22;
        uVar26 = (uVar26 + uVar31 + 1) - (uint)(local_238.bits[uVar26 + uVar31] == 0);
        if (uVar29 < 0x40) goto LAB_0189a4c7;
      }
LAB_0189a4b6:
      switchD_012e3010::default(__s,0,(ulong)(uVar31 - 1) * 8 + 8);
    }
LAB_0189a4c7:
    uVar19 = (ulong)local_440.used;
    if (local_440.used < uVar26) {
LAB_0189a4cf:
      uVar32 = 0;
    }
    else {
      uVar32 = 1;
      if (local_440.used <= uVar26) {
        do {
          if (uVar19 == 0) {
            uVar32 = (ulong)((uint)uVar40 & 1);
            break;
          }
          lVar24 = uVar19 - 1;
          lVar44 = uVar19 - 1;
          if (local_440.bits[lVar44] < local_238.bits[lVar24]) goto LAB_0189a4cf;
          uVar19 = uVar19 - 1;
        } while (local_440.bits[lVar44] <= local_238.bits[lVar24]);
      }
    }
    pcVar23 = (char *)0x7ff0000000000000;
    if (uVar32 + uVar40 != 0x7ff0000000000000) {
      local_468->tag = 0x14;
      (local_468->uni).u64 = uVar32 + uVar40 | (ulong)(cVar1 == '-') << 0x3f;
      return (char *)pbVar42;
    }
    if ((char)local_458 < '\0') {
      if (*local_460 != (u8 *)0x0) {
        **local_460 = '\0';
      }
LAB_0189a89f:
      local_468->tag = ((long)pbVar42 - (long)local_450) * 0x100 + 1;
      (local_468->uni).str = (char *)local_450;
      *local_460 = pbVar42;
      return (char *)pbVar42;
    }
    if ((local_458 & 0x10) != 0) {
      local_468->tag = 0x14;
      val = local_468;
      if (cVar1 == '-') {
        pcVar23 = (char *)0xfff0000000000000;
      }
LAB_0189a90c:
      (val->uni).str = pcVar23;
      return (char *)pbVar42;
    }
  }
  else {
    uVar2 = 0x3f;
    if (uVar40 != 0) {
      for (; uVar40 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar29 = (uVar29 + iVar28) - (int)(uVar2 ^ 0x3f);
    if ((int)uVar29 < 0x3c1) {
      uVar40 = (uVar40 << ((byte)(uVar2 ^ 0x3f) & 0x3f)) >> 0xb;
      if ((int)uVar29 < -0x43d) {
        if (uVar29 < 0xfffffb8f) goto LAB_0189a183;
        uVar40 = uVar40 >> (-(char)uVar29 - 0x3dU & 0x3f);
      }
      else {
        uVar40 = uVar40 & 0xfffffffffffff | (ulong)(uVar29 + 0x43e) << 0x34;
        if (uVar40 == 0x7ff0000000000000) goto LAB_0189a04a;
      }
      goto LAB_01899f82;
    }
LAB_0189a04a:
    if (cVar43 < '\0') {
      if (*local_460 != (u8 *)0x0) {
        **local_460 = '\0';
      }
      goto LAB_0189a89f;
    }
    if ((flg & 0x10) != 0) {
      val->tag = 0x14;
      pcVar23 = (char *)(((ulong)(cVar1 != '-') << 0x3f) + -0x10000000000000);
      goto LAB_0189a90c;
    }
  }
  local_470 = "number is infinity when parsed as double";
  dat = (char *)local_450;
  local_478 = local_450;
LAB_01899a26:
  if (err == (yyjson_read_err *)0x0) {
    return (char *)0x0;
  }
  pbVar42 = local_478 + -(long)dat;
  if (local_478 < dat || local_478 + -(long)dat == (byte *)0x0) {
    pbVar42 = (byte *)0x0;
  }
  err->pos = (size_t)pbVar42;
  err->msg = local_470;
  err->code = 9;
  return (char *)0x0;
}

Assistant:

const char *yyjson_read_number(const char *dat,
                               yyjson_val *val,
                               yyjson_read_flag flg,
                               const yyjson_alc *alc,
                               yyjson_read_err *err) {
#define return_err(_pos, _code, _msg) do { \
    err->pos = _pos > hdr ? (usize)(_pos - hdr) : 0; \
    err->msg = _msg; \
    err->code = YYJSON_READ_ERROR_##_code; \
    return NULL; \
} while (false)

    u8 *hdr = constcast(u8 *)dat, *cur = hdr;
    bool raw; /* read number as raw */
    u8 *raw_end; /* raw end for null-terminator */
    u8 **pre; /* previous raw end pointer */
    const char *msg;
    yyjson_read_err dummy_err;

#if !YYJSON_HAS_IEEE_754 || YYJSON_DISABLE_FAST_FP_CONV
    u8 buf[128];
    usize dat_len;
#endif

    if (!err) err = &dummy_err;
    if (unlikely(!dat)) {
        return_err(cur, INVALID_PARAMETER, "input data is NULL");
    }
    if (unlikely(!val)) {
        return_err(cur, INVALID_PARAMETER, "output value is NULL");
    }

#if !YYJSON_HAS_IEEE_754 || YYJSON_DISABLE_FAST_FP_CONV
    if (!alc) alc = &YYJSON_DEFAULT_ALC;
    dat_len = strlen(dat);
    if (dat_len < sizeof(buf)) {
        memcpy(buf, dat, dat_len + 1);
        hdr = buf;
        cur = hdr;
    } else {
        hdr = (u8 *)alc->malloc(alc->ctx, dat_len + 1);
        cur = hdr;
        if (unlikely(!hdr)) {
            return_err(cur, MEMORY_ALLOCATION, "memory allocation failed");
        }
        memcpy(hdr, dat, dat_len + 1);
    }
    hdr[dat_len] = 0;
#endif

    raw = (flg & (YYJSON_READ_NUMBER_AS_RAW | YYJSON_READ_BIGNUM_AS_RAW)) != 0;
    raw_end = NULL;
    pre = raw ? &raw_end : NULL;

#if !YYJSON_HAS_IEEE_754 || YYJSON_DISABLE_FAST_FP_CONV
    if (!read_number(&cur, pre, flg, val, &msg)) {
        if (dat_len >= sizeof(buf)) alc->free(alc->ctx, hdr);
        return_err(cur, INVALID_NUMBER, msg);
    }
    if (dat_len >= sizeof(buf)) alc->free(alc->ctx, hdr);
    if (yyjson_is_raw(val)) val->uni.str = dat;
    return dat + (cur - hdr);
#else
    if (!read_number(&cur, pre, flg, val, &msg)) {
        return_err(cur, INVALID_NUMBER, msg);
    }
    return (const char *)cur;
#endif

#undef return_err
}